

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O3

UBool icu_63::PropNameData::containsName(BytesTrie *trie,char *name)

{
  char c;
  byte bVar1;
  UStringTrieResult UVar2;
  
  if (name == (char *)0x0) {
    return '\0';
  }
  c = *name;
  if (c == '\0') {
    UVar2 = USTRINGTRIE_NO_VALUE;
  }
  else {
    UVar2 = USTRINGTRIE_NO_VALUE;
    do {
      while( true ) {
        name = name + 1;
        bVar1 = uprv_asciitolower_63(c);
        if (((0x3f < bVar1 - 0x20) ||
            ((0x8000000000002001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) == 0)) &&
           (4 < (byte)(bVar1 - 9))) break;
        c = *name;
        if (c == '\0') goto LAB_0029a804;
      }
      if ((UVar2 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) {
        return '\0';
      }
      UVar2 = BytesTrie::next(trie,(uint)bVar1);
      c = *name;
    } while (c != '\0');
  }
LAB_0029a804:
  return 1 < (int)UVar2;
}

Assistant:

UBool PropNameData::containsName(BytesTrie &trie, const char *name) {
    if(name==NULL) {
        return FALSE;
    }
    UStringTrieResult result=USTRINGTRIE_NO_VALUE;
    char c;
    while((c=*name++)!=0) {
        c=uprv_invCharToLowercaseAscii(c);
        // Ignore delimiters '-', '_', and ASCII White_Space.
        if(c==0x2d || c==0x5f || c==0x20 || (0x09<=c && c<=0x0d)) {
            continue;
        }
        if(!USTRINGTRIE_HAS_NEXT(result)) {
            return FALSE;
        }
        result=trie.next((uint8_t)c);
    }
    return USTRINGTRIE_HAS_VALUE(result);
}